

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O3

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::Unroll
          (LoopUnrollerUtilsImpl *this,Loop *loop,size_t factor)

{
  pointer *pppIVar1;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  pointer pOVar2;
  pointer ppIVar3;
  pointer ppBVar4;
  Instruction *pIVar5;
  BasicBlock *pBVar6;
  iterator iVar7;
  LoopUnrollerUtilsImpl *this_01;
  _Hash_node_base *p_Var8;
  vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *this_02;
  pointer ppIVar9;
  pointer ppIVar10;
  byte bVar11;
  array<signed_char,_4UL> aVar12;
  array<signed_char,_4UL> aVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  Instruction *pIVar16;
  ulong uVar17;
  mapped_type *pmVar18;
  mapped_type *ppIVar19;
  ulong uVar20;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  Instruction *inst;
  pointer ppBVar21;
  pointer ppIVar22;
  size_t sVar23;
  Instruction *phi;
  pointer ppIVar24;
  _Hash_node_base *p_Var25;
  Instruction *induction_clone;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions;
  Instruction *local_1c8;
  uint32_t local_1bc;
  size_t local_1b8;
  vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *local_1b0;
  BasicBlock **local_1a8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_1a0;
  Instruction **local_198;
  vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *local_190;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_188;
  Loop *local_180;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_178;
  size_t local_170;
  undefined1 local_168 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_148;
  undefined8 uStack_140;
  pointer local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  BasicBlock *local_100;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_f8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_c0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_88;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  local_1b8 = factor;
  pIVar16 = BasicBlock::GetLoopMergeInst(loop->loop_header_);
  if (pIVar16 == (Instruction *)0x0) {
    __assert_fail("loop_merge_inst && \"Loop merge instruction could not be found after entering unroller \" \"(should have exited before this)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unroller.cpp"
                  ,0x20b,
                  "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::MarkLoopControlAsDontUnroll(Loop *) const"
                 );
  }
  local_168._24_8_ = local_168 + 0x10;
  local_168._0_8_ = &PTR__SmallVector_00b02ef8;
  local_148._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_168._16_4_ = (array<signed_char,_4UL>)0x2;
  local_168._8_8_ = (pointer)0x1;
  uVar20 = (ulong)(pIVar16->has_result_id_ & 1) + 1;
  if (pIVar16->has_type_id_ == false) {
    uVar20 = (ulong)pIVar16->has_result_id_;
  }
  uVar20 = uVar20 + 2;
  pOVar2 = (pIVar16->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar17 = ((long)(pIVar16->operands_).
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
           -0x5555555555555555;
  if (uVar17 < uVar20 || uVar17 - uVar20 == 0) {
LAB_005b017a:
    local_168._24_8_ = local_168 + 0x10;
    local_148._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_168._8_8_ = (pointer)0x1;
    local_168._0_8_ = &PTR__SmallVector_00b02ef8;
    __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2b8,
                  "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)");
  }
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)
             ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
             (ulong)(uint)((int)uVar20 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_168);
  local_168._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_148._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_148,local_148._M_head_impl);
  }
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Loop::GetInductionVariables(loop,&local_48);
  ppIVar10 = local_48.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppIVar9 = local_48.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppIVar24 = local_48.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uStack_128 = this->loop_condition_block_;
  local_168._0_8_ = this->loop_induction_variable_;
  local_130 = loop->loop_latch_;
  local_f8._M_buckets = &local_f8._M_single_bucket;
  local_148._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  uStack_140 = 0;
  local_138 = (pointer)0x0;
  local_120 = 0;
  uStack_118 = 0;
  local_110 = 0;
  uStack_108 = 0;
  local_f8._M_bucket_count = 1;
  local_f8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f8._M_element_count = 0;
  local_f8._M_rehash_policy._M_max_load_factor = 1.0;
  local_f8._M_rehash_policy._M_next_resize = 0;
  local_f8._M_single_bucket = (__node_base_ptr)0x0;
  local_c0._M_buckets = &local_c0._M_single_bucket;
  local_c0._M_bucket_count = 1;
  local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c0._M_element_count = 0;
  local_c0._M_rehash_policy._M_max_load_factor = 1.0;
  local_c0._M_rehash_policy._M_next_resize = 0;
  local_c0._M_single_bucket = (__node_base_ptr)0x0;
  local_88._M_buckets = &local_88._M_single_bucket;
  local_88._M_bucket_count = 1;
  local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88._M_element_count = 0;
  local_88._M_rehash_policy._M_max_load_factor = 1.0;
  local_88._M_rehash_policy._M_next_resize = 0;
  local_88._M_single_bucket = (__node_base_ptr)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppIVar22 = (this->state_).previous_phis_.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppIVar3 = (this->state_).previous_phis_.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->state_).previous_phi_ = (Instruction *)local_168._0_8_;
  (this->state_).previous_phis_.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = ppIVar24;
  (this->state_).previous_phis_.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppIVar9;
  (this->state_).previous_phis_.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = ppIVar10;
  local_168._24_8_ = (uint *)0x0;
  local_168._8_8_ = (Instruction *)0x0;
  local_168._16_4_ = (array<signed_char,_4UL>)0x0;
  local_168._20_4_ = (array<signed_char,_4UL>)0x0;
  local_148._M_head_impl._0_4_ = 0;
  local_148._M_head_impl._4_4_ = 0;
  uStack_140._0_4_ = 0;
  uStack_140._4_4_ = 0;
  ppIVar24 = (pointer)0x0;
  if (ppIVar22 != (pointer)0x0) {
    operator_delete(ppIVar22,(long)ppIVar3 - (long)ppIVar22);
    ppIVar24 = local_138;
  }
  ppIVar22 = (this->state_).new_phis_.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppIVar3 = (this->state_).new_phis_.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *(undefined4 *)
   &(this->state_).new_phis_.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = local_148._M_head_impl._0_4_;
  *(undefined4 *)
   ((long)&(this->state_).new_phis_.
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = local_148._M_head_impl._4_4_;
  *(undefined4 *)
   &(this->state_).new_phis_.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (undefined4)uStack_140;
  *(undefined4 *)
   ((long)&(this->state_).new_phis_.
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = uStack_140._4_4_;
  (this->state_).new_phis_.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = ppIVar24;
  local_148._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  uStack_140 = 0;
  local_138 = (pointer)0x0;
  if (ppIVar22 != (pointer)0x0) {
    operator_delete(ppIVar22,(long)ppIVar3 - (long)ppIVar22);
  }
  (this->state_).new_latch_block = local_100;
  *(undefined4 *)&(this->state_).new_condition_block = (undefined4)local_110;
  *(undefined4 *)((long)&(this->state_).new_condition_block + 4) = local_110._4_4_;
  *(undefined4 *)&(this->state_).new_header_block = (undefined4)uStack_108;
  *(undefined4 *)((long)&(this->state_).new_header_block + 4) = uStack_108._4_4_;
  *(undefined4 *)&(this->state_).new_phi = (undefined4)local_120;
  *(undefined4 *)((long)&(this->state_).new_phi + 4) = local_120._4_4_;
  *(undefined4 *)&(this->state_).new_continue_block = (undefined4)uStack_118;
  *(undefined4 *)((long)&(this->state_).new_continue_block + 4) = uStack_118._4_4_;
  *(undefined4 *)&(this->state_).previous_latch_block_ = (undefined4)local_130;
  *(undefined4 *)((long)&(this->state_).previous_latch_block_ + 4) = local_130._4_4_;
  *(undefined4 *)&(this->state_).previous_condition_block_ = (undefined4)uStack_128;
  *(undefined4 *)((long)&(this->state_).previous_condition_block_ + 4) = uStack_128._4_4_;
  local_178 = &(this->state_).new_blocks._M_h;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(local_178,&local_f8);
  this_00 = &(this->state_).new_inst;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&this_00->_M_h,&local_c0);
  local_1a0 = &(this->state_).ids_to_new_inst._M_h;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(local_1a0,&local_88);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_88);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_c0);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_f8);
  if (local_148._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    operator_delete(local_148._M_head_impl,(long)local_138 - (long)local_148._M_head_impl);
  }
  if ((Instruction *)local_168._8_8_ != (Instruction *)0x0) {
    operator_delete((void *)local_168._8_8_,local_168._24_8_ - local_168._8_8_);
  }
  local_1b8 = local_1b8 - 1;
  if (local_1b8 != 0) {
    local_188 = &(this->state_).previous_phis_;
    local_1b0 = (vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
                &(this->state_).new_phis_;
    local_1a8 = &(this->state_).previous_latch_block_;
    local_190 = (vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
                &this->invalidated_instructions_;
    local_198 = &(this->state_).new_phi;
    sVar23 = 0;
    local_180 = loop;
    do {
      ppBVar4 = (this->loop_blocks_inorder_).
                super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_170 = sVar23;
      for (ppBVar21 = (this->loop_blocks_inorder_).
                      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppBVar21 != ppBVar4;
          ppBVar21 = ppBVar21 + 1) {
        CopyBasicBlock(this,loop,*ppBVar21,false);
      }
      pIVar16 = ((*local_1a8)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      if ((pIVar16 == (Instruction *)0x0) ||
         ((pIVar16->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
LAB_005b0199:
        __assert_fail("!insts_.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                      ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
      }
      pIVar16 = ((*local_1a8)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
      pIVar5 = (((this->state_).new_header_block)->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      aVar12._M_elems[0] = '\0';
      aVar12._M_elems[1] = '\0';
      aVar12._M_elems[2] = '\0';
      aVar12._M_elems[3] = '\0';
      if (pIVar5->has_result_id_ == true) {
        aVar12._M_elems =
             (_Type)Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
      }
      local_168._0_8_ = &PTR__SmallVector_00b02ef8;
      local_168._24_8_ = local_168 + 0x10;
      local_148._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_168._16_4_ = aVar12._M_elems;
      local_168._8_8_ = (Instruction *)0x1;
      uVar20 = (ulong)(pIVar16->has_result_id_ & 1) + 1;
      if (pIVar16->has_type_id_ == false) {
        uVar20 = (ulong)pIVar16->has_result_id_;
      }
      pOVar2 = (pIVar16->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar17 = ((long)(pIVar16->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
               -0x5555555555555555;
      if (uVar17 < uVar20 || uVar17 - uVar20 == 0) goto LAB_005b017a;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
                 (ulong)(uint)((int)uVar20 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_168);
      local_168._0_8_ = &PTR__SmallVector_00b02ef8;
      if (local_148._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_148,local_148._M_head_impl);
      }
      if ((this->context_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        analysis::DefUseManager::UpdateDefUse
                  ((this->context_->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,pIVar16);
      }
      pBVar6 = (this->state_).new_latch_block;
      pIVar16 = (pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      if ((pIVar16 == (Instruction *)0x0) ||
         ((pIVar16->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
      goto LAB_005b0199;
      pIVar16 = (pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
      pIVar5 = (loop->loop_header_->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      aVar13._M_elems[0] = '\0';
      aVar13._M_elems[1] = '\0';
      aVar13._M_elems[2] = '\0';
      aVar13._M_elems[3] = '\0';
      if (pIVar5->has_result_id_ == true) {
        aVar13._M_elems =
             (_Type)Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
      }
      local_168._0_8_ = &PTR__SmallVector_00b02ef8;
      local_168._24_8_ = local_168 + 0x10;
      local_148._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_168._16_4_ = aVar13._M_elems;
      local_168._8_8_ = (pointer)0x1;
      uVar20 = (ulong)(pIVar16->has_result_id_ & 1) + 1;
      if (pIVar16->has_type_id_ == false) {
        uVar20 = (ulong)pIVar16->has_result_id_;
      }
      pOVar2 = (pIVar16->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar17 = ((long)(pIVar16->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
               -0x5555555555555555;
      if (uVar17 < uVar20 || uVar17 - uVar20 == 0) goto LAB_005b017a;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
                 (ulong)(uint)((int)uVar20 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_168);
      local_168._0_8_ = &PTR__SmallVector_00b02ef8;
      if (local_148._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_148,local_148._M_head_impl);
      }
      IRContext::AnalyzeUses(this->context_,pIVar16);
      local_168._0_8_ = (Instruction *)0x0;
      local_168._8_8_ = (Instruction *)0x0;
      local_168._16_4_ = (array<signed_char,_4UL>)0x0;
      local_168._20_4_ = (array<signed_char,_4UL>)0x0;
      Loop::GetInductionVariables
                (loop,(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       *)local_168);
      uVar14 = extraout_EDX;
      if (local_168._8_8_ != local_168._0_8_) {
        uVar20 = 0;
        do {
          pIVar16 = (Instruction *)
                    (&((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_168._0_8_)->
                      _vptr_IntrusiveNodeBase)[uVar20];
          if ((pIVar16->has_result_id_ != true) ||
             (uVar14 = Instruction::GetSingleWordOperand(pIVar16,(uint)pIVar16->has_type_id_),
             uVar14 == 0)) {
            __assert_fail("primary_copy->result_id() != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unroller.cpp"
                          ,0x2ba,
                          "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::CopyBody(Loop *, bool)"
                         );
          }
          uVar14 = 0;
          if (pIVar16->has_result_id_ == true) {
            uVar14 = Instruction::GetSingleWordOperand(pIVar16,(uint)pIVar16->has_type_id_);
          }
          local_1c8 = (Instruction *)CONCAT44(local_1c8._4_4_,uVar14);
          pmVar18 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this_00,(key_type *)&local_1c8);
          ppIVar19 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_1a0,pmVar18);
          local_1c8 = *ppIVar19;
          iVar7._M_current =
               (this->state_).new_phis_.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (this->state_).new_phis_.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
            _M_realloc_insert<spvtools::opt::Instruction*const&>(local_1b0,iVar7,&local_1c8);
          }
          else {
            *iVar7._M_current = local_1c8;
            pppIVar1 = &(this->state_).new_phis_.
                        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppIVar1 = *pppIVar1 + 1;
          }
          if ((local_1c8->has_result_id_ != true) ||
             (uVar14 = Instruction::GetSingleWordOperand(local_1c8,(uint)local_1c8->has_type_id_),
             uVar14 == 0)) {
            __assert_fail("induction_clone->result_id() != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unroller.cpp"
                          ,0x2bf,
                          "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::CopyBody(Loop *, bool)"
                         );
          }
          ppIVar22 = (this->state_).previous_phis_.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (ppIVar22 ==
              (this->state_).previous_phis_.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            bVar11 = pIVar16->has_result_id_;
            uVar15 = 0;
            uVar14 = 0;
            if ((bool)bVar11 == true) {
              uVar14 = Instruction::GetSingleWordOperand(pIVar16,(uint)pIVar16->has_type_id_);
              bVar11 = pIVar16->has_result_id_;
            }
            if ((bVar11 & 1) != 0) {
              uVar15 = Instruction::GetSingleWordOperand(pIVar16,(uint)pIVar16->has_type_id_);
            }
            local_1bc = uVar15;
            pmVar18 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_00,&local_1bc);
            *pmVar18 = uVar14;
            uVar14 = extraout_EDX_03;
          }
          else {
            this_01 = (LoopUnrollerUtilsImpl *)ppIVar22[uVar20];
            pIVar5 = ((*local_1a8)->label_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
            uVar15 = 0;
            phi = (Instruction *)0x0;
            uVar14 = extraout_EDX_00;
            if (pIVar5->has_result_id_ == true) {
              uVar14 = Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
              phi = (Instruction *)(ulong)uVar14;
              uVar14 = extraout_EDX_01;
            }
            uVar14 = GetPhiDefID(this_01,phi,uVar14);
            if (pIVar16->has_result_id_ == true) {
              uVar15 = Instruction::GetSingleWordOperand(pIVar16,(uint)pIVar16->has_type_id_);
            }
            local_1bc = uVar15;
            pmVar18 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_00,&local_1bc);
            *pmVar18 = uVar14;
            uVar14 = extraout_EDX_02;
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 < (ulong)((long)(local_168._8_8_ - local_168._0_8_) >> 3));
      }
      pBVar6 = (this->state_).new_condition_block;
      if (pBVar6 != this->loop_condition_block_) {
        FoldConditionBlock(this,pBVar6,uVar14);
      }
      loop = local_180;
      pIVar16 = (local_180->loop_header_->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      bVar11 = pIVar16->has_result_id_;
      uVar14 = 0;
      if ((bool)bVar11 == true) {
        uVar15 = Instruction::GetSingleWordOperand(pIVar16,(uint)pIVar16->has_type_id_);
        pIVar16 = (loop->loop_header_->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        bVar11 = pIVar16->has_result_id_;
      }
      else {
        uVar15 = 0;
      }
      if ((bVar11 & 1) != 0) {
        uVar14 = Instruction::GetSingleWordOperand(pIVar16,(uint)pIVar16->has_type_id_);
      }
      local_1c8 = (Instruction *)CONCAT44(local_1c8._4_4_,uVar14);
      pmVar18 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_00,(key_type *)&local_1c8);
      *pmVar18 = uVar15;
      for (p_Var25 = (this->state_).new_blocks._M_h._M_before_begin._M_nxt; this_02 = local_190,
          p_Var25 != (_Hash_node_base *)0x0; p_Var25 = p_Var25->_M_nxt) {
        p_Var8 = p_Var25[2]._M_nxt;
        for (pIVar16 = (Instruction *)p_Var8[4]._M_nxt; pIVar16 != (Instruction *)(p_Var8 + 3);
            pIVar16 = (pIVar16->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
          RemapOperands(this,pIVar16);
        }
      }
      ppIVar3 = (this->state_).new_phis_.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar22 = (this->state_).new_phis_.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppIVar22 != ppIVar3;
          ppIVar22 = ppIVar22 + 1) {
        local_1c8 = *ppIVar22;
        iVar7._M_current =
             (this->invalidated_instructions_).
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this->invalidated_instructions_).
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          _M_realloc_insert<spvtools::opt::Instruction*const&>(this_02,iVar7,&local_1c8);
        }
        else {
          *iVar7._M_current = local_1c8;
          pppIVar1 = &(this->invalidated_instructions_).
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppIVar1 = *pppIVar1 + 1;
        }
      }
      (this->state_).previous_phi_ = (this->state_).new_phi;
      (this->state_).previous_latch_block_ = (this->state_).new_latch_block;
      (this->state_).previous_condition_block_ = (this->state_).new_condition_block;
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      _M_move_assign(local_188,local_1b0);
      local_198[2] = (Instruction *)0x0;
      local_198[3] = (Instruction *)0x0;
      *local_198 = (Instruction *)0x0;
      local_198[1] = (Instruction *)0x0;
      local_198[4] = (Instruction *)0x0;
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(local_178);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&this_00->_M_h);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(local_1a0);
      sVar23 = local_170;
      if ((Instruction *)local_168._0_8_ != (Instruction *)0x0) {
        operator_delete((void *)local_168._0_8_,local_168._16_8_ - local_168._0_8_);
      }
      sVar23 = sVar23 + 1;
    } while (sVar23 != local_1b8);
  }
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::Unroll(Loop* loop, size_t factor) {
  // If we unroll a loop partially it will not be safe to unroll it further.
  // This is due to the current method of calculating the number of loop
  // iterations.
  MarkLoopControlAsDontUnroll(loop);

  std::vector<Instruction*> inductions;
  loop->GetInductionVariables(inductions);
  state_ = LoopUnrollState{loop_induction_variable_, loop->GetLatchBlock(),
                           loop_condition_block_, std::move(inductions)};
  for (size_t i = 0; i < factor - 1; ++i) {
    CopyBody(loop, true);
  }
}